

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O0

Image * Unit_Test::randomImage(vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  bool bVar1;
  uint32_t height_;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_type sVar5;
  uchar *puVar6;
  size_type sVar7;
  const_reference pvVar8;
  uchar *puVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  Image *in_RDI;
  uint8_t *outXEnd;
  uint8_t *outX;
  size_t id;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint32_t rowSize;
  size_t valueSize;
  uint32_t width;
  uint32_t height;
  Image *image;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 uVar10;
  uint8_t in_stack_ffffffffffffff86;
  undefined1 uVar11;
  uint8_t in_stack_ffffffffffffff87;
  undefined1 uVar12;
  uint32_t in_stack_ffffffffffffff8c;
  Image *this;
  undefined8 in_stack_ffffffffffffffa8;
  size_type local_50;
  uchar *local_40;
  
  this = in_RDI;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  if (bVar1) {
    randomImage((uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                (uint32_t)in_stack_ffffffffffffffa8);
  }
  else {
    height_ = anon_unknown.dwarf_13e898::randomSize();
    anon_unknown.dwarf_13e898::randomSize();
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (this,in_stack_ffffffffffffff8c,height_,in_stack_ffffffffffffff87,
               in_stack_ffffffffffffff86);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(this);
    uVar4 = uVar2;
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(this);
    uVar10 = (undefined2)uVar3;
    uVar11 = (undefined1)(uVar3 >> 0x10);
    uVar12 = (undefined1)(uVar3 >> 0x18);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
    if ((sVar5 <= uVar3) && ((int)((ulong)uVar3 % (sVar5 & 0xffffffff)) == 0)) {
      Image_Function::OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
                ((uint32_t *)this,(uint32_t *)CONCAT44(uVar4,height_),
                 (ImageTemplate<unsigned_char> *)
                 CONCAT17(uVar12,CONCAT16(uVar11,CONCAT24(uVar10,in_stack_ffffffffffffff80))));
    }
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(this);
    local_40 = PenguinV_Image::ImageTemplate<unsigned_char>::data(this);
    puVar6 = local_40 + uVar2 * uVar4;
    local_50 = 0;
    for (; local_40 != puVar6; local_40 = local_40 + uVar4) {
      for (puVar9 = local_40; puVar9 != local_40 + uVar3; puVar9 = puVar9 + 1) {
        sVar7 = local_50 + 1;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (in_RSI,local_50);
        *puVar9 = *pvVar8;
        local_50 = sVar7;
        if (sVar7 == sVar5) {
          local_50 = 0;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

PenguinV_Image::Image randomImage( const std::vector <uint8_t> & value )
    {
        if( value.empty() )
            return randomImage();

        PenguinV_Image::Image image( randomSize(), randomSize() );

        uint32_t height = image.height();
        uint32_t width = image.width();

        const size_t valueSize = value.size();

        if ( valueSize <= width && (width % static_cast<uint32_t>(valueSize)) == 0 )
            Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize  = image.rowSize();
        uint8_t * outY          = image.data();
        const uint8_t * outYEnd = outY + height * rowSize;

        size_t id = 0;

        for ( ; outY != outYEnd; outY += rowSize ) {
            uint8_t * outX = outY;
            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX ) {
                (*outX) = value[id++];
                if ( id == valueSize )
                    id = 0u;
            }
        }

        return image;
    }